

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

vector<EvaluationState,_std::allocator<EvaluationState>_> * __thiscall
PDA::nextEvaluations
          (vector<EvaluationState,_std::allocator<EvaluationState>_> *__return_storage_ptr__,
          PDA *this,vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations,
          char input)

{
  _Map_pointer this_00;
  bool bVar1;
  reference pEVar2;
  reference pvVar3;
  reference ppTVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  size_type sVar6;
  const_reference __x;
  State *currentStates;
  EvaluationState local_1d0;
  int local_174;
  undefined1 local_170 [4];
  int j;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newStack;
  Transition *transition;
  iterator __end2;
  iterator __begin2;
  vector<Transition_*,_std::allocator<Transition_*>_> *__range2;
  undefined1 local_e0 [8];
  vector<Transition_*,_std::allocator<Transition_*>_> transitions;
  string stackTop;
  undefined1 local_98 [8];
  EvaluationState evaluation;
  iterator __end1;
  iterator __begin1;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *__range1;
  char input_local;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations_local;
  PDA *this_local;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *newEvaluations;
  
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<EvaluationState,_std::allocator<EvaluationState>_>::begin(evaluations);
  evaluation.currentStates =
       (State *)std::vector<EvaluationState,_std::allocator<EvaluationState>_>::end(evaluations);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
                                     *)&evaluation.currentStates), bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
             ::operator*(&__end1);
    EvaluationState::EvaluationState((EvaluationState *)local_98,pEVar2);
    pvVar3 = std::
             stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_98);
    std::__cxx11::string::string
              ((string *)
               &transitions.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)pvVar3);
    this_00 = evaluation.stack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::__cxx11::string::string
              ((string *)&__range2,
               (string *)
               &transitions.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    State::getTransitionsOnInput
              ((vector<Transition_*,_std::allocator<Transition_*>_> *)local_e0,(State *)this_00,
               input,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_98);
    __end2 = std::vector<Transition_*,_std::allocator<Transition_*>_>::begin
                       ((vector<Transition_*,_std::allocator<Transition_*>_> *)local_e0);
    transition = (Transition *)
                 std::vector<Transition_*,_std::allocator<Transition_*>_>::end
                           ((vector<Transition_*,_std::allocator<Transition_*>_> *)local_e0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
                                       *)&transition), bVar1) {
      ppTVar4 = __gnu_cxx::
                __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>
                ::operator*(&__end2);
      newStack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)*ppTVar4;
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_170,
              (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_98);
      pvVar5 = Transition::getStackPush_abi_cxx11_
                         ((Transition *)
                          newStack.c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar5);
      local_174 = (int)sVar6;
      while (local_174 = local_174 + -1, -1 < local_174) {
        pvVar5 = Transition::getStackPush_abi_cxx11_
                           ((Transition *)
                            newStack.c.
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node);
        __x = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](pvVar5,(long)local_174);
        std::
        stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_170,__x);
      }
      currentStates =
           Transition::getStateTo
                     ((Transition *)
                      newStack.c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
      EvaluationState::EvaluationState
                (&local_1d0,
                 (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_170,currentStates);
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::push_back
                (__return_storage_ptr__,&local_1d0);
      EvaluationState::~EvaluationState(&local_1d0);
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_170);
      __gnu_cxx::
      __normal_iterator<Transition_**,_std::vector<Transition_*,_std::allocator<Transition_*>_>_>::
      operator++(&__end2);
    }
    std::vector<Transition_*,_std::allocator<Transition_*>_>::~vector
              ((vector<Transition_*,_std::allocator<Transition_*>_> *)local_e0);
    std::__cxx11::string::~string
              ((string *)
               &transitions.super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    EvaluationState::~EvaluationState((EvaluationState *)local_98);
    __gnu_cxx::
    __normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<EvaluationState> PDA::nextEvaluations(std::vector<EvaluationState> evaluations, char input) {
    std::vector<EvaluationState> newEvaluations;
    for (auto evaluation: evaluations) {
        std::string stackTop = evaluation.stack.top();
        std::vector<Transition *> transitions = evaluation.currentStates->getTransitionsOnInput(input, stackTop);
        evaluation.stack.pop();
        for (Transition *transition: transitions) {
            std::stack<std::string> newStack = evaluation.stack;
            for (int j = transition->getStackPush().size() - 1; j >= 0; --j) {
//                if (transition->getStackPush()[j] != "e") { // e is epsilon, so nothing has to be pushed then
                    newStack.push(transition->getStackPush()[j]);
//                }
            }
            newEvaluations.push_back(EvaluationState(newStack, transition->getStateTo()));
        }
    }
    return newEvaluations;
}